

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_rotate8_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int iVar1;
  TCGContext_conflict2 *s_00;
  uint uVar2;
  TCGTemp *pTVar3;
  TCGv_i32 pTVar4;
  uint left;
  uintptr_t o;
  uintptr_t o_2;
  TCGv_i32 ret;
  uintptr_t o_1;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  
  s_00 = s->uc->tcg_ctx;
  uVar2 = insn & 7;
  pTVar4 = s_00->cpu_dregs[uVar2];
  pTVar3 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  iVar1 = s->release_count;
  if ((long)iVar1 < 8) {
    left = insn & 0x100;
    ret_01 = (TCGv_i32)((long)pTVar3 - (long)s_00);
    s->release_count = iVar1 + 1;
    s->release[iVar1] = ret_01;
    tcg_gen_ext8u_i32_m68k(s_00,ret_01,pTVar4);
    pTVar4 = *(TCGv_i32 *)((long)s_00->cpu_dregs + (ulong)(insn >> 6 & 0x38));
    pTVar3 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
    ret = (TCGv_i32)((long)pTVar3 - (long)s_00);
    tcg_gen_andi_i32_m68k(s_00,ret,pTVar4,0x3f);
    pTVar3 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
    ret_00 = (TCGv_i32)((long)pTVar3 - (long)s_00);
    if ((insn & 8) == 0) {
      tcg_gen_op2_m68k(s_00,INDEX_op_movi_i32,(TCGArg)pTVar3,9);
      tcg_gen_remu_i32_m68k(s_00,ret_00,ret,ret_00);
      pTVar4 = rotate_x(s_00,ret_01,ret_00,left,8);
      rotate_x_flags(s_00,ret_01,pTVar4,8);
      tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(pTVar4 + (long)s_00));
    }
    else {
      tcg_gen_andi_i32_m68k(s_00,ret_00,pTVar4,7);
      rotate(s_00,ret_01,ret_00,left,8);
      tcg_gen_movcond_i32_m68k(s_00,TCG_COND_EQ,QREG_CC_C,ret,QREG_CC_V,QREG_CC_V,QREG_CC_C);
    }
    tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret_00 + (long)s_00));
    tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret + (long)s_00));
    gen_partset_reg(s_00,0,s_00->cpu_dregs[uVar2],ret_01);
    set_cc_op(s,CC_OP_FLAGS);
    return;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
             ,0x91,"s->release_count < MAX_TO_RELEASE");
}

Assistant:

DISAS_INSN(rotate8_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv src;
    TCGv t0, t1;
    int left = (insn & 0x100);

    reg = gen_extend(s, DREG(insn, 0), OS_BYTE, 0);
    src = DREG(insn, 9);
    /* shift in [0..63] */
    t0 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_andi_i32(tcg_ctx, t0, src, 63);
    t1 = tcg_temp_new_i32(tcg_ctx);
    if (insn & 8) {
        tcg_gen_andi_i32(tcg_ctx, t1, src, 7);
        rotate(tcg_ctx, reg, t1, left, 8);
        /* if shift == 0, clear C */
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_EQ, QREG_CC_C,
                            t0, QREG_CC_V /* 0 */,
                            QREG_CC_V /* 0 */, QREG_CC_C);
    } else {
        TCGv X;
        /* modulo 9 */
        tcg_gen_movi_i32(tcg_ctx, t1, 9);
        tcg_gen_remu_i32(tcg_ctx, t1, t0, t1);
        X = rotate_x(tcg_ctx, reg, t1, left, 8);
        rotate_x_flags(tcg_ctx, reg, X, 8);
        tcg_temp_free(tcg_ctx, X);
    }
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t0);
    gen_partset_reg(tcg_ctx, OS_BYTE, DREG(insn, 0), reg);
    set_cc_op(s, CC_OP_FLAGS);
}